

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_3_channels_with_9_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float *pfVar15;
  float *pfVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pfVar15 = output_buffer + 3;
  pfVar16 = horizontal_coefficients + 8;
  while( true ) {
    lVar17 = (long)horizontal_contributors->n0;
    fVar20 = pfVar16[-8];
    fVar8 = pfVar16[-7];
    fVar9 = pfVar16[-6];
    fVar10 = pfVar16[-5];
    pfVar1 = decode_buffer + lVar17 * 3;
    pfVar2 = decode_buffer + lVar17 * 3 + 4;
    pfVar3 = decode_buffer + lVar17 * 3 + 8;
    fVar11 = pfVar16[-4];
    fVar12 = pfVar16[-3];
    fVar13 = pfVar16[-2];
    fVar14 = pfVar16[-1];
    pfVar4 = decode_buffer + lVar17 * 3 + 0xc;
    pfVar5 = decode_buffer + lVar17 * 3 + 0x10;
    pfVar6 = decode_buffer + lVar17 * 3 + 0x14;
    fVar21 = fVar13 * *pfVar6 + fVar9 * *pfVar3;
    fVar22 = fVar14 * pfVar6[1] + fVar10 * pfVar3[1];
    fVar19 = *pfVar16;
    pfVar7 = decode_buffer + lVar17 * 3 + 0x18;
    fVar23 = pfVar7[2] * fVar19 + pfVar4[2] * fVar11 + pfVar1[2] * fVar20;
    fVar24 = pfVar7[3] * 0.0 + pfVar4[3] * fVar12 + pfVar1[3] * fVar8;
    fVar18 = fVar13 * pfVar5[2] + fVar9 * pfVar2[2] +
             *pfVar7 * fVar19 + *pfVar4 * fVar11 + *pfVar1 * fVar20 + fVar22 + fVar24;
    fVar19 = fVar13 * pfVar5[3] + fVar9 * pfVar2[3] +
             pfVar7[1] * fVar19 + pfVar4[1] * fVar11 + pfVar1[1] * fVar20 +
             fVar14 * pfVar6[2] + fVar10 * pfVar3[2] + fVar12 * *pfVar5 + fVar8 * *pfVar2;
    fVar20 = fVar21 + fVar23 +
             fVar14 * pfVar6[3] + fVar10 * pfVar3[3] + fVar12 * pfVar5[1] + fVar8 * pfVar2[1];
    if (output_buffer + output_sub_size * 3 <= pfVar15) break;
    horizontal_contributors = horizontal_contributors + 1;
    pfVar15[-3] = fVar18;
    pfVar15[-2] = fVar19;
    pfVar15[-1] = fVar20;
    *pfVar15 = fVar22 + fVar24 + fVar21 + fVar23;
    pfVar15 = pfVar15 + 3;
    pfVar16 = pfVar16 + coefficient_width;
  }
  *(ulong *)(pfVar15 + -3) = CONCAT44(fVar19,fVar18);
  pfVar15[-1] = fVar20;
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_9_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__1_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}